

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O0

void tcu::separableConvolve<4,3>
               (PixelBufferAccess *dst,ConstPixelBufferAccess *src,int shiftX,int shiftY,
               vector<float,_std::allocator<float>_> *kernelX,
               vector<float,_std::allocator<float>_> *kernelY)

{
  void **this;
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  TextureFormat *format;
  size_type sVar6;
  size_type sVar7;
  const_reference pvVar8;
  Vector<float,_4> local_13c;
  Vector<float,_4> local_12c;
  Vector<float,_4> local_11c;
  deUint32 local_10c;
  value_type local_108;
  deUint32 p_1;
  float f_1;
  int ky;
  Vec4 sum_1;
  int i_1;
  int j_1;
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  deUint32 local_b8;
  value_type local_b4;
  deUint32 p;
  float f;
  int kx;
  Vec4 sum;
  int i;
  int j;
  int kh;
  int kw;
  undefined1 local_80 [8];
  PixelBufferAccess tmpAccess;
  TextureLevel tmp;
  vector<float,_std::allocator<float>_> *kernelY_local;
  vector<float,_std::allocator<float>_> *kernelX_local;
  int shiftY_local;
  int shiftX_local;
  ConstPixelBufferAccess *src_local;
  PixelBufferAccess *dst_local;
  
  format = ConstPixelBufferAccess::getFormat(&dst->super_ConstPixelBufferAccess);
  iVar3 = ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess);
  iVar4 = ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
  this = &tmpAccess.super_ConstPixelBufferAccess.m_data;
  TextureLevel::TextureLevel((TextureLevel *)this,format,iVar3,iVar4,1);
  TextureLevel::getAccess((PixelBufferAccess *)local_80,(TextureLevel *)this);
  sVar6 = std::vector<float,_std::allocator<float>_>::size(kernelX);
  sVar7 = std::vector<float,_std::allocator<float>_>::size(kernelY);
  sum.m_data[3] = 0.0;
  while( true ) {
    fVar1 = sum.m_data[3];
    iVar3 = ConstPixelBufferAccess::getHeight(src);
    if (iVar3 <= (int)fVar1) break;
    sum.m_data[2] = 0.0;
    while( true ) {
      fVar1 = sum.m_data[2];
      iVar3 = ConstPixelBufferAccess::getWidth(src);
      if (iVar3 <= (int)fVar1) break;
      Vector<float,_4>::Vector((Vector<float,_4> *)&f,0.0);
      for (p = 0; fVar2 = sum.m_data[3], fVar1 = sum.m_data[2], (int)p < (int)sVar6; p = p + 1) {
        pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                           (kernelX,(long)(int)(~p + (int)sVar6));
        local_b4 = *pvVar8;
        iVar3 = (int)sum.m_data[2] + p;
        iVar4 = ConstPixelBufferAccess::getWidth(src);
        iVar3 = de::clamp<int>(iVar3 - shiftX,0,iVar4 + -1);
        local_b8 = readUnorm8<3>(src,iVar3,(int)sum.m_data[3]);
        toFloatVec((tcu *)&local_d8,local_b8);
        operator*((tcu *)&local_c8,&local_d8,local_b4);
        Vector<float,_4>::operator+=((Vector<float,_4> *)&f,&local_c8);
      }
      Vector<float,_4>::Vector((Vector<float,_4> *)&i_1,(Vector<float,_4> *)&f);
      dVar5 = toColor((Vec4 *)&i_1);
      writeUnorm8<4>((PixelBufferAccess *)local_80,(int)fVar2,(int)fVar1,dVar5);
      sum.m_data[2] = (float)((int)sum.m_data[2] + 1);
    }
    sum.m_data[3] = (float)((int)sum.m_data[3] + 1);
  }
  sum_1.m_data[3] = 0.0;
  while( true ) {
    fVar1 = sum_1.m_data[3];
    iVar3 = ConstPixelBufferAccess::getHeight(src);
    if (iVar3 <= (int)fVar1) break;
    sum_1.m_data[2] = 0.0;
    while( true ) {
      fVar1 = sum_1.m_data[2];
      iVar3 = ConstPixelBufferAccess::getWidth(src);
      if (iVar3 <= (int)fVar1) break;
      Vector<float,_4>::Vector((Vector<float,_4> *)&f_1,0.0);
      for (p_1 = 0; fVar2 = sum_1.m_data[3], fVar1 = sum_1.m_data[2], (int)p_1 < (int)sVar7;
          p_1 = p_1 + 1) {
        pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                           (kernelY,(long)(int)(~p_1 + (int)sVar7));
        local_108 = *pvVar8;
        iVar3 = (int)sum_1.m_data[3] + p_1;
        iVar4 = TextureLevel::getWidth
                          ((TextureLevel *)&tmpAccess.super_ConstPixelBufferAccess.m_data);
        iVar3 = de::clamp<int>(iVar3 - shiftY,0,iVar4 + -1);
        local_10c = readUnorm8<4>((ConstPixelBufferAccess *)local_80,iVar3,(int)sum_1.m_data[2]);
        toFloatVec((tcu *)&local_12c,local_10c);
        operator*((tcu *)&local_11c,&local_12c,local_108);
        Vector<float,_4>::operator+=((Vector<float,_4> *)&f_1,&local_11c);
      }
      Vector<float,_4>::Vector(&local_13c,(Vector<float,_4> *)&f_1);
      dVar5 = toColor(&local_13c);
      writeUnorm8<4>(dst,(int)fVar1,(int)fVar2,dVar5);
      sum_1.m_data[2] = (float)((int)sum_1.m_data[2] + 1);
    }
    sum_1.m_data[3] = (float)((int)sum_1.m_data[3] + 1);
  }
  TextureLevel::~TextureLevel((TextureLevel *)&tmpAccess.super_ConstPixelBufferAccess.m_data);
  return;
}

Assistant:

static void separableConvolve (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src, int shiftX, int shiftY, const std::vector<float>& kernelX, const std::vector<float>& kernelY)
{
	DE_ASSERT(dst.getWidth() == src.getWidth() && dst.getHeight() == src.getHeight());

	TextureLevel		tmp			(dst.getFormat(), dst.getHeight(), dst.getWidth());
	PixelBufferAccess	tmpAccess	= tmp.getAccess();

	int kw = (int)kernelX.size();
	int kh = (int)kernelY.size();

	// Horizontal pass
	// \note Temporary surface is written in column-wise order
	for (int j = 0; j < src.getHeight(); j++)
	{
		for (int i = 0; i < src.getWidth(); i++)
		{
			Vec4 sum(0);

			for (int kx = 0; kx < kw; kx++)
			{
				float		f = kernelX[kw-kx-1];
				deUint32	p = readUnorm8<SrcChannels>(src, de::clamp(i+kx-shiftX, 0, src.getWidth()-1), j);

				sum += toFloatVec(p)*f;
			}

			writeUnorm8<DstChannels>(tmpAccess, j, i, toColor(sum));
		}
	}

	// Vertical pass
	for (int j = 0; j < src.getHeight(); j++)
	{
		for (int i = 0; i < src.getWidth(); i++)
		{
			Vec4 sum(0.0f);

			for (int ky = 0; ky < kh; ky++)
			{
				float		f = kernelY[kh-ky-1];
				deUint32	p = readUnorm8<DstChannels>(tmpAccess, de::clamp(j+ky-shiftY, 0, tmp.getWidth()-1), i);

				sum += toFloatVec(p)*f;
			}

			writeUnorm8<DstChannels>(dst, i, j, toColor(sum));
		}
	}
}